

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall
apngasm::APNGAsm::write_chunk(APNGAsm *this,FILE *f,char *name,uchar *data,uint length)

{
  undefined4 uVar1;
  undefined4 local_34;
  undefined1 local_30 [4];
  uint crc;
  uchar buf [4];
  uint length_local;
  uchar *data_local;
  char *name_local;
  FILE *f_local;
  APNGAsm *this_local;
  
  crc = length;
  _buf = data;
  uVar1 = crc32(0,0,0);
  png_save_uint_32(local_30,crc);
  fwrite(local_30,1,4,(FILE *)f);
  fwrite(name,1,4,(FILE *)f);
  local_34 = crc32(uVar1,name,4);
  if (*(int *)name == 0x54416466) {
    this->_next_seq_num = this->_next_seq_num + 1;
    png_save_uint_32(local_30);
    fwrite(local_30,1,4,(FILE *)f);
    local_34 = crc32(local_34,local_30,4);
    crc = crc - 4;
  }
  if ((_buf != (uchar *)0x0) && (crc != 0)) {
    fwrite(_buf,1,(ulong)crc,(FILE *)f);
    local_34 = crc32(local_34,_buf,crc);
  }
  png_save_uint_32(local_30,local_34);
  fwrite(local_30,1,4,(FILE *)f);
  return;
}

Assistant:

void APNGAsm::write_chunk(FILE * f, const char * name, unsigned char * data, unsigned int length)
  {
    unsigned char buf[4];
    unsigned int crc = crc32(0, Z_NULL, 0);

    png_save_uint_32(buf, length);
    fwrite(buf, 1, 4, f);
    fwrite(name, 1, 4, f);
    crc = crc32(crc, (const Bytef *)name, 4);

    if (memcmp(name, "fdAT", 4) == 0)
    {
      png_save_uint_32(buf, _next_seq_num++);
      fwrite(buf, 1, 4, f);
      crc = crc32(crc, buf, 4);
      length -= 4;
    }

    if (data != NULL && length > 0)
    {
      fwrite(data, 1, length, f);
      crc = crc32(crc, data, length);
    }

    png_save_uint_32(buf, crc);
    fwrite(buf, 1, 4, f);
  }